

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall
MT32Emu::RendererImpl<short>::doRenderStreams
          (RendererImpl<short> *this,DACOutputStreams<short> *streams,Bit32u len)

{
  MidiEventQueue *pMVar1;
  Synth *pSVar2;
  MidiEvent *pMVar3;
  uint uVar4;
  ulong uVar5;
  DACOutputStreams<short> tmpStreams;
  DACOutputStreams<short> local_58;
  
  local_58.nonReverbLeft = streams->nonReverbLeft;
  local_58.nonReverbRight = streams->nonReverbRight;
  local_58.reverbDryLeft = streams->reverbDryLeft;
  local_58.reverbDryRight = streams->reverbDryRight;
  local_58.reverbWetLeft = streams->reverbWetLeft;
  local_58.reverbWetRight = streams->reverbWetRight;
  if (len != 0) {
    do {
      pSVar2 = (this->super_Renderer).synth;
      uVar5 = 1;
      if (pSVar2->abortingPoly == (Poly *)0x0) {
        pMVar1 = pSVar2->midiQueue;
        uVar4 = 0x1000;
        if (pMVar1->startPosition != pMVar1->endPosition) {
          if (pMVar1->ringBuffer != (MidiEvent *)0x0) {
            pMVar3 = pMVar1->ringBuffer + pMVar1->startPosition;
            uVar4 = pMVar3->timestamp - pSVar2->renderedSampleCount;
            if ((int)uVar4 < 1) {
              if (pMVar3->sysexData == (Bit8u *)0x0) {
                Synth::playMsgNow(pSVar2,(pMVar3->field_1).sysexLength);
                pSVar2 = (this->super_Renderer).synth;
                if (pSVar2->abortingPoly != (Poly *)0x0) goto LAB_0017c97b;
              }
              else {
                Synth::playSysexNow(pSVar2,pMVar3->sysexData,(pMVar3->field_1).sysexLength);
                pSVar2 = (this->super_Renderer).synth;
              }
              MidiEventQueue::dropMidiEvent(pSVar2->midiQueue);
              goto LAB_0017c97b;
            }
          }
        }
        if (len < uVar4) {
          uVar4 = len;
        }
        if (0xfff < uVar4) {
          uVar4 = 0x1000;
        }
        uVar5 = (ulong)uVar4;
      }
LAB_0017c97b:
      produceStreams(this,&local_58,(Bit32u)uVar5);
      if (local_58.nonReverbLeft != (short *)0x0) {
        local_58.nonReverbLeft = local_58.nonReverbLeft + uVar5;
      }
      if (local_58.nonReverbRight != (short *)0x0) {
        local_58.nonReverbRight = local_58.nonReverbRight + uVar5;
      }
      if (local_58.reverbDryLeft != (short *)0x0) {
        local_58.reverbDryLeft = local_58.reverbDryLeft + uVar5;
      }
      if (local_58.reverbDryRight != (short *)0x0) {
        local_58.reverbDryRight = local_58.reverbDryRight + uVar5;
      }
      if (local_58.reverbWetLeft != (short *)0x0) {
        local_58.reverbWetLeft = local_58.reverbWetLeft + uVar5;
      }
      if (local_58.reverbWetRight != (short *)0x0) {
        local_58.reverbWetRight = local_58.reverbWetRight + uVar5;
      }
      len = len - (Bit32u)uVar5;
    } while (len != 0);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderStreams(const DACOutputStreams<Sample> &streams, Bit32u len)
{
	DACOutputStreams<Sample> tmpStreams = streams;
	while (len > 0) {
		// We need to ensure zero-duration notes will play so add minimum 1-sample delay.
		Bit32u thisLen = 1;
		if (!isAbortingPoly()) {
			const volatile MidiEventQueue::MidiEvent *nextEvent = getMidiQueue().peekMidiEvent();
			Bit32s samplesToNextEvent = (nextEvent != NULL) ? Bit32s(nextEvent->timestamp - getRenderedSampleCount()) : MAX_SAMPLES_PER_RUN;
			if (samplesToNextEvent > 0) {
				thisLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
				if (thisLen > Bit32u(samplesToNextEvent)) {
					thisLen = samplesToNextEvent;
				}
			} else {
				if (nextEvent->sysexData == NULL) {
					synth.playMsgNow(nextEvent->shortMessageData);
					// If a poly is aborting we don't drop the event from the queue.
					// Instead, we'll return to it again when the abortion is done.
					if (!isAbortingPoly()) {
						getMidiQueue().dropMidiEvent();
					}
				} else {
					synth.playSysexNow(nextEvent->sysexData, nextEvent->sysexLength);
					getMidiQueue().dropMidiEvent();
				}
			}
		}
		produceStreams(tmpStreams, thisLen);
		advanceStreams(tmpStreams, thisLen);
		len -= thisLen;
	}
}